

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_decoder.cc
# Opt level: O0

void __thiscall
draco::RAnsBitDecoder::DecodeLeastSignificantBits32(RAnsBitDecoder *this,int nbits,uint32_t *value)

{
  bool bVar1;
  int *in_RDX;
  int in_ESI;
  uint32_t result;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  undefined4 local_c;
  
  local_1c = 0;
  for (local_c = in_ESI; local_c != 0; local_c = local_c + -1) {
    local_1c = local_1c << 1;
    bVar1 = DecodeNextBit((RAnsBitDecoder *)CONCAT44(local_1c,in_stack_ffffffffffffffd0));
    local_1c = local_1c + (uint)bVar1;
  }
  *in_RDX = local_1c;
  return;
}

Assistant:

void RAnsBitDecoder::DecodeLeastSignificantBits32(int nbits, uint32_t *value) {
  DRACO_DCHECK_EQ(true, nbits <= 32);
  DRACO_DCHECK_EQ(true, nbits > 0);

  uint32_t result = 0;
  while (nbits) {
    result = (result << 1) + DecodeNextBit();
    --nbits;
  }
  *value = result;
}